

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O1

size_t embree::os_shrink(void *ptr,size_t bytesNew,size_t bytesOld,bool hugepages)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar6 = (int)CONCAT71(in_register_00000009,hugepages) != 0;
  uVar4 = 0xfffffffffffff000;
  if (bVar6) {
    uVar4 = 0xffffffffffe00000;
  }
  lVar2 = 0xfff;
  if (bVar6) {
    lVar2 = 0x1fffff;
  }
  uVar5 = bytesNew + lVar2 & uVar4;
  uVar4 = lVar2 + bytesOld & uVar4;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    iVar1 = munmap((void *)((long)ptr + uVar5),uVar4 - uVar5);
    uVar4 = uVar5;
    if (iVar1 == -1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = rtcSetGeometryTimeRange;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return uVar4;
}

Assistant:

size_t os_shrink(void* ptr, size_t bytesNew, size_t bytesOld, bool hugepages) 
  {
    const size_t pageSize = hugepages ? PAGE_SIZE_2M : PAGE_SIZE_4K;
    bytesNew = (bytesNew+pageSize-1) & ~(pageSize-1);
    bytesOld = (bytesOld+pageSize-1) & ~(pageSize-1);
    if (bytesNew >= bytesOld)
      return bytesOld;

    if (munmap((char*)ptr+bytesNew,bytesOld-bytesNew) == -1)
      throw std::bad_alloc();

    return bytesNew;
  }